

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  int iVar1;
  int local_24;
  int i;
  Index *pSrc_local;
  Index *pDest_local;
  
  if ((pDest->nKeyCol == pSrc->nKeyCol) && (pDest->nColumn == pSrc->nColumn)) {
    if (pDest->onError == pSrc->onError) {
      for (local_24 = 0; local_24 < (int)(uint)pSrc->nKeyCol; local_24 = local_24 + 1) {
        if (pSrc->aiColumn[local_24] != pDest->aiColumn[local_24]) {
          return 0;
        }
        if ((pSrc->aiColumn[local_24] == -2) &&
           (iVar1 = sqlite3ExprCompare((Parse *)0x0,pSrc->aColExpr->a[local_24].pExpr,
                                       pDest->aColExpr->a[local_24].pExpr,-1), iVar1 != 0)) {
          return 0;
        }
        if (pSrc->aSortOrder[local_24] != pDest->aSortOrder[local_24]) {
          return 0;
        }
        iVar1 = sqlite3_stricmp(pSrc->azColl[local_24],pDest->azColl[local_24]);
        if (iVar1 != 0) {
          return 0;
        }
      }
      iVar1 = sqlite3ExprCompare((Parse *)0x0,pSrc->pPartIdxWhere,pDest->pPartIdxWhere,-1);
      if (iVar1 == 0) {
        pDest_local._4_4_ = 1;
      }
      else {
        pDest_local._4_4_ = 0;
      }
    }
    else {
      pDest_local._4_4_ = 0;
    }
  }
  else {
    pDest_local._4_4_ = 0;
  }
  return pDest_local._4_4_;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nKeyCol!=pSrc->nKeyCol || pDest->nColumn!=pSrc->nColumn ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nKeyCol; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aiColumn[i]==XN_EXPR ){
      assert( pSrc->aColExpr!=0 && pDest->aColExpr!=0 );
      if( sqlite3ExprCompare(0, pSrc->aColExpr->a[i].pExpr,
                             pDest->aColExpr->a[i].pExpr, -1)!=0 ){
        return 0;   /* Different expressions in the index */
      }
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( sqlite3_stricmp(pSrc->azColl[i],pDest->azColl[i])!=0 ){
      return 0;   /* Different collating sequences */
    }
  }
  if( sqlite3ExprCompare(0, pSrc->pPartIdxWhere, pDest->pPartIdxWhere, -1) ){
    return 0;     /* Different WHERE clauses */
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}